

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cc
# Opt level: O3

ReadResult __thiscall FileLineReader::ReadLine(FileLineReader *this,char *out,size_t len)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ReadResult RVar4;
  size_t sVar5;
  
  if (len != 0) {
    RVar4 = kReadError;
    if ((FILE *)this->file_ != (FILE *)0x0) {
      sVar5 = 0x7fffffff;
      if (len < 0x7fffffff) {
        sVar5 = len;
      }
      pcVar2 = fgets(out,(int)sVar5,(FILE *)this->file_);
      if (pcVar2 == (char *)0x0) {
        iVar1 = feof((FILE *)this->file_);
        RVar4 = (iVar1 == 0) + kReadEOF;
      }
      else {
        sVar3 = strlen(out);
        RVar4 = kReadSuccess;
        if ((sVar3 == sVar5 - 1) && (RVar4 = kReadSuccess, out[sVar5 - 2] != '\n')) {
          iVar1 = feof((FILE *)this->file_);
          if (iVar1 == 0) {
            ReadLine();
            RVar4 = kReadError;
          }
        }
      }
    }
    return RVar4;
  }
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/test/file_test.cc"
                ,0x179,"virtual FileTest::ReadResult FileLineReader::ReadLine(char *, size_t)");
}

Assistant:

FileTest::ReadResult ReadLine(char *out, size_t len) override {
    assert(len > 0);
    if (file_ == nullptr) {
      return FileTest::kReadError;
    }

    len = std::min(len, size_t{INT_MAX});
    if (fgets(out, static_cast<int>(len), file_) == nullptr) {
      return feof(file_) ? FileTest::kReadEOF : FileTest::kReadError;
    }

    if (strlen(out) == len - 1 && out[len - 2] != '\n' && !feof(file_)) {
      fprintf(stderr, "Line too long.\n");
      return FileTest::kReadError;
    }

    return FileTest::kReadSuccess;
  }